

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
            *this,size_t pos)

{
  undefined4 uVar1;
  Entry *pEVar2;
  size_t sVar3;
  Entry *pEVar4;
  size_t back;
  size_t pos_local;
  Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
  *this_local;
  
  pEVar2 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::operator[]
                     (&this->rows,pos);
  Impl<0UL,_false>::erase(this,pos,pEVar2);
  sVar3 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::size(&this->rows);
  sVar3 = sVar3 - 1;
  if (pos != sVar3) {
    pEVar2 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::operator[]
                       (&this->rows,sVar3);
    Impl<0UL,_false>::move(this,sVar3,pos,pEVar2);
    pEVar2 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::operator[]
                       (&this->rows,sVar3);
    pEVar2 = mv<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry>(pEVar2);
    pEVar4 = Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::operator[]
                       (&this->rows,pos);
    pEVar4->key = pEVar2->key;
    uVar1 = *(undefined4 *)&pEVar2->field_0xc;
    pEVar4->value = pEVar2->value;
    *(undefined4 *)&pEVar4->field_0xc = uVar1;
  }
  Vector<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry>::removeLast(&this->rows);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}